

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-actions.h
# Opt level: O2

ReturnAction<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_>
__thiscall
testing::Return<std::vector<solitaire::cards::Card,std::allocator<solitaire::cards::Card>>>
          (testing *this,
          vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *value)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ReturnAction<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_> RVar1;
  _Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> local_28;
  
  local_28._M_impl.super__Vector_impl_data._M_start =
       (value->super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>).
       _M_impl.super__Vector_impl_data._M_start;
  local_28._M_impl.super__Vector_impl_data._M_finish =
       (value->super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  local_28._M_impl.super__Vector_impl_data._M_end_of_storage =
       (value->super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>).
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (value->super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (value->super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (value->super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  internal::
  ReturnAction<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_>::
  ReturnAction((ReturnAction<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_>
                *)this,(vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *)
                       &local_28);
  std::_Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>::~_Vector_base
            (&local_28);
  RVar1.value_.
  super___shared_ptr<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = extraout_RDX._M_pi;
  RVar1.value_.
  super___shared_ptr<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this;
  return (ReturnAction<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>_>
          )RVar1.value_.
           super___shared_ptr<std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

internal::ReturnAction<R> Return(R value) {
  return internal::ReturnAction<R>(std::move(value));
}